

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::next_word(Fl_Text_Display *this)

{
  uint uVar1;
  int iVar2;
  int pos;
  
  for (pos = this->mCursorPos; pos < this->mBuffer->mLength;
      pos = Fl_Text_Buffer::next_char(this->mBuffer,pos)) {
    uVar1 = Fl_Text_Buffer::char_at(this->mBuffer,pos);
    iVar2 = fl_isseparator(uVar1);
    if (iVar2 != 0) break;
  }
  do {
    if (this->mBuffer->mLength <= pos) {
LAB_001cf450:
      insert_position(this,pos);
      return;
    }
    uVar1 = Fl_Text_Buffer::char_at(this->mBuffer,pos);
    iVar2 = fl_isseparator(uVar1);
    if (iVar2 == 0) goto LAB_001cf450;
    pos = Fl_Text_Buffer::next_char(this->mBuffer,pos);
  } while( true );
}

Assistant:

void Fl_Text_Display::next_word() {
  int pos = insert_position();

  while (pos < buffer()->length() && !fl_isseparator(buffer()->char_at(pos))) {
    pos = buffer()->next_char(pos);
  }

  while (pos < buffer()->length() && fl_isseparator(buffer()->char_at(pos))) {
    pos = buffer()->next_char(pos);
  }

  insert_position( pos );
}